

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O2

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle,uchar *buffer,size_t size)

{
  byte bVar1;
  char cVar2;
  CONTROL_PACKET_TYPE CVar3;
  int iVar4;
  uchar *puVar5;
  size_t sVar6;
  BUFFER_HANDLE handle_00;
  LOGGER_LOG p_Var7;
  CONTROL_PACKET_TYPE CVar8;
  size_t index;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  
  if (handle == (MQTTCODEC_HANDLE)0x0) {
    iVar4 = 0x425;
  }
  else if (size == 0 || buffer == (uchar *)0x0) {
    handle->currPacket = PACKET_TYPE_ERROR;
    iVar4 = 0x42c;
  }
  else {
    uVar9 = 0;
    iVar4 = 0;
    while ((uVar9 < size && (iVar4 == 0))) {
      bVar1 = buffer[uVar9];
      if (handle->codecState == CODEC_STATE_VAR_HEADER) {
        if (handle->headerData == (BUFFER_HANDLE)0x0) {
          handle->codecState = CODEC_STATE_PAYLOAD;
          iVar4 = 0;
        }
        else {
          puVar5 = BUFFER_u_char(handle->headerData);
          if (puVar5 == (uchar *)0x0) {
            handle->currPacket = PACKET_TYPE_ERROR;
            iVar4 = 0x48c;
          }
          else {
            sVar6 = handle->bufferOffset;
            handle->bufferOffset = sVar6 + 1;
            puVar5[sVar6] = bVar1;
            sVar6 = BUFFER_length(handle->headerData);
            iVar4 = 0;
            if (sVar6 <= handle->bufferOffset) {
LAB_00161a7a:
              completePacketData(handle);
              iVar4 = 0;
            }
          }
        }
      }
      else if (handle->codecState == CODEC_STATE_FIXED_HEADER) {
        if (handle->currPacket == UNKNOWN_TYPE) {
          CVar3 = (uint)bVar1 & 0xf;
          handle->headerFlags = CVar3;
          CVar8 = (uint)bVar1 & PACKET_INVALID2_TYPE;
          handle->currPacket = CVar8;
          cVar2 = (char)CVar3;
          iVar4 = 0;
          switch(CVar8) {
          case PACKET_INVALID1_TYPE:
          case PACKET_INVALID2_TYPE:
            handle->currPacket = PACKET_TYPE_ERROR;
            iVar4 = 0x442;
            break;
          default:
            iVar4 = 0;
            if (cVar2 != '\0') {
              handle->currPacket = PACKET_TYPE_ERROR;
              iVar4 = 0x452;
            }
            break;
          case PUBLISH_TYPE:
            break;
          case PUBREL_TYPE:
          case SUBSCRIBE_TYPE:
          case UNSUBSCRIBE_TYPE:
            iVar4 = 0;
            if (cVar2 != '\x02') {
              handle->currPacket = PACKET_TYPE_ERROR;
              iVar4 = 0x45c;
            }
          }
        }
        else {
          sVar6 = handle->remainLenIndex;
          handle->remainLenIndex = sVar6 + 1;
          handle->storeRemainLen[sVar6] = bVar1;
          if ((char)bVar1 < '\0') {
            if (handle->remainLenIndex == 4) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                iVar4 = 0x246;
                pcVar10 = "MQTT packet len is invalid";
                goto LAB_00161c2a;
              }
              goto LAB_00161c2f;
            }
          }
          else {
            uVar11 = handle->storeRemainLen[0] & 0x7f;
            sVar6 = (size_t)uVar11;
            if ((char)handle->storeRemainLen[0] < '\0') {
              uVar11 = uVar11 | (handle->storeRemainLen[1] & 0x7f) << 7;
              sVar6 = (size_t)uVar11;
              if ((char)handle->storeRemainLen[1] < '\0') {
                if ((char)handle->storeRemainLen[2] < '\0') {
                  p_Var7 = xlogging_get_log_function();
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    iVar4 = 0x21d;
                    pcVar10 = "Receive buffer too large for MQTT packet";
                    goto LAB_00161c2a;
                  }
                  goto LAB_00161c2f;
                }
                sVar6 = (size_t)(uVar11 | (handle->storeRemainLen[2] & 0x7f) << 0xe);
              }
            }
            handle->codecState = CODEC_STATE_VAR_HEADER;
            handle->remainLenIndex = 0;
            handle->storeRemainLen[0] = '\0';
            handle->storeRemainLen[1] = '\0';
            handle->storeRemainLen[2] = '\0';
            handle->storeRemainLen[3] = '\0';
            if ((int)sVar6 != 0) {
              handle->bufferOffset = 0;
              handle_00 = BUFFER_new();
              handle->headerData = handle_00;
              if (handle_00 == (BUFFER_HANDLE)0x0) {
                p_Var7 = xlogging_get_log_function();
                if (p_Var7 != (LOGGER_LOG)0x0) {
                  iVar4 = 0x22f;
                  pcVar10 = "Failed BUFFER_new";
LAB_00161c2a:
                  (*p_Var7)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                            ,"prepareheaderDataInfo",iVar4,1,pcVar10);
                }
              }
              else {
                iVar4 = BUFFER_pre_build(handle_00,sVar6);
                if (iVar4 == 0) goto LAB_00161bc4;
                p_Var7 = xlogging_get_log_function();
                if (p_Var7 != (LOGGER_LOG)0x0) {
                  iVar4 = 0x237;
                  pcVar10 = "Failed BUFFER_pre_build";
                  goto LAB_00161c2a;
                }
              }
LAB_00161c2f:
              handle->currPacket = PACKET_TYPE_ERROR;
              iVar4 = 0x46d;
              goto switchD_00161a1d_caseD_30;
            }
          }
LAB_00161bc4:
          iVar4 = 0;
          if (handle->currPacket == PINGRESP_TYPE) {
            if (buffer[uVar9] == '\0') goto LAB_00161a7a;
            handle->currPacket = PACKET_TYPE_ERROR;
            iVar4 = 0x47a;
          }
        }
      }
      else {
        handle->currPacket = PACKET_TYPE_ERROR;
        iVar4 = 0x4a1;
      }
switchD_00161a1d_caseD_30:
      uVar9 = uVar9 + 1;
    }
  }
  return iVar4;
}

Assistant:

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle, const unsigned char* buffer, size_t size)
{
    int result;
    MQTTCODEC_INSTANCE* codec_Data = (MQTTCODEC_INSTANCE*)handle;
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    if (codec_Data == NULL)
    {
        result = MU_FAILURE;
    }
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    /* Codes_SRS_MQTT_CODEC_07_032: [If the parameters size is zero then mqtt_codec_bytesReceived shall return a non-zero value.] */
    else if (buffer == NULL || size == 0)
    {
        codec_Data->currPacket = PACKET_TYPE_ERROR;
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_033: [mqtt_codec_bytesReceived constructs a sequence of bytes into the corresponding MQTT packets and on success returns zero.] */
        result = 0;
        size_t index = 0;
        for (index = 0; index < size && result == 0; index++)
        {
            uint8_t iterator = ((int8_t*)buffer)[index];
            if (codec_Data->codecState == CODEC_STATE_FIXED_HEADER)
            {
                if (codec_Data->currPacket == UNKNOWN_TYPE)
                {
                    codec_Data->currPacket = processControlPacketType(iterator, &codec_Data->headerFlags);

                    // validate packet type and invalid reserved header flags
                    switch (codec_Data->currPacket)
                    {
                        case PACKET_INVALID1_TYPE:
                        case PACKET_INVALID2_TYPE:
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                            break;

                        case CONNECT_TYPE:
                        case CONNACK_TYPE:
                        case PUBACK_TYPE:
                        case PUBREC_TYPE:
                        case PUBCOMP_TYPE:
                        case SUBACK_TYPE:
                        case UNSUBACK_TYPE:
                        case PINGREQ_TYPE:
                        case PINGRESP_TYPE:
                        case DISCONNECT_TYPE:
                            if (codec_Data->headerFlags & 0x0F) // flags must be all zeros
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBREL_TYPE:
                        case SUBSCRIBE_TYPE:
                        case UNSUBSCRIBE_TYPE:
                            if ((codec_Data->headerFlags & 0x0F) != 0x02) // only bit 1 must be set
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBLISH_TYPE:
                        case CONTROL_PACKET_TYPE_INVALID: 
                        case PACKET_TYPE_ERROR:
                        case UNKNOWN_TYPE:
                            break;
                    }
                }
                else
                {
                    if (prepareheaderDataInfo(codec_Data, iterator) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else if (codec_Data->currPacket == PINGRESP_TYPE)
                    {
                        // PINGRESP must not have a payload
                        if (((int8_t*)buffer)[index] == 0)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                        else
                        {
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                        }
                    }
                }
            }
            else if (codec_Data->codecState == CODEC_STATE_VAR_HEADER)
            {
                if (codec_Data->headerData == NULL)
                {
                    codec_Data->codecState = CODEC_STATE_PAYLOAD;
                }
                else
                {
                    uint8_t* dataBytes = BUFFER_u_char(codec_Data->headerData);
                    if (dataBytes == NULL)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else
                    {
                        // Increment the data
                        dataBytes += codec_Data->bufferOffset++;
                        *dataBytes = iterator;

                        size_t totalLen = BUFFER_length(codec_Data->headerData);
                        if (codec_Data->bufferOffset >= totalLen)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                    }
                }
            }
            else
            {
                /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                codec_Data->currPacket = PACKET_TYPE_ERROR;
                result = MU_FAILURE;
            }
        }
    }
    return result;
}